

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# val_Base.cpp
# Opt level: O1

void __thiscall mbc::Val::ValBase::ValBase(ValBase *this,ValBase *other)

{
  int *piVar1;
  
  this->_vptr_ValBase = (_func_int **)&PTR__ValBase_001406a0;
  piVar1 = other->count_;
  this->count_ = piVar1;
  this->invaild_waring_ = other->invaild_waring_;
  this->is_vaild_ = other->is_vaild_;
  this->type_ = other->type_;
  *piVar1 = *piVar1 + 1;
  return;
}

Assistant:

ValBase::ValBase(const ValBase& other) {
    count_          = other.count_;
    invaild_waring_ = other.invaild_waring_;
    is_vaild_       = other.is_vaild_;
    type_           = other.type_;

    // add the ref-counter with 1
    ++ *count_;
}